

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateInternalAccessorDefinitions
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  if ((this->implicit_weak_field_ & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "const $type$&\n$classname$::_Internal::$name$(const $classname$* msg) {\n  return *msg->$field_member$;\n}\n"
              );
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "const ::$proto_ns$::MessageLite& $classname$::_Internal::$name$(\n    const $classname$* msg) {\n  if (msg->$name$_ != nullptr) {\n    return *msg->$name$_;\n  } else if ($type_default_instance_ptr$ != nullptr) {\n    return *reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n        $type_default_instance_ptr$);\n  } else {\n    return *::$proto_ns$::internal::ImplicitWeakMessage::default_instance();\n  }\n}\n"
              );
    Formatter::operator()<>
              ((Formatter *)local_50,
               "::$proto_ns$::MessageLite*\n$classname$::_Internal::mutable_$name$($classname$* msg) {\n"
              );
    bVar1 = HasHasbit((this->super_FieldGenerator).descriptor_);
    if (bVar1) {
      Formatter::operator()<>((Formatter *)local_50,"  msg->$set_hasbit$\n");
    }
    Formatter::operator()<>
              ((Formatter *)local_50,
               "  if (msg->$name$_ == nullptr) {\n    if ($type_default_instance_ptr$ == nullptr) {\n      msg->$name$_ = ::$proto_ns$::Arena::CreateMessage<\n          ::$proto_ns$::internal::ImplicitWeakMessage>(\n              msg->GetArenaForAllocation());\n    } else {\n      msg->$name$_ = \n          reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n              $type_default_instance_ptr$)->New(\n                  msg->GetArenaForAllocation());\n    }\n  }\n  return msg->$name$_;\n}\n"
              );
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateInternalAccessorDefinitions(
    io::Printer* printer) const {
  // In theory, these accessors could be inline in _Internal. However, in
  // practice, the linker is then not able to throw them out making implicit
  // weak dependencies not work at all.
  Formatter format(printer, variables_);
  if (implicit_weak_field_) {
    // These private accessors are used by MergeFrom and
    // MergePartialFromCodedStream, and their purpose is to provide access to
    // the field without creating a strong dependency on the message type.
    format(
        "const ::$proto_ns$::MessageLite& $classname$::_Internal::$name$(\n"
        "    const $classname$* msg) {\n"
        "  if (msg->$name$_ != nullptr) {\n"
        "    return *msg->$name$_;\n"
        "  } else if ($type_default_instance_ptr$ != nullptr) {\n"
        "    return *reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n"
        "        $type_default_instance_ptr$);\n"
        "  } else {\n"
        "    return "
        "*::$proto_ns$::internal::ImplicitWeakMessage::default_instance();\n"
        "  }\n"
        "}\n");
    format(
        "::$proto_ns$::MessageLite*\n"
        "$classname$::_Internal::mutable_$name$($classname$* msg) {\n");
    if (HasHasbit(descriptor_)) {
      format("  msg->$set_hasbit$\n");
    }
    format(
        "  if (msg->$name$_ == nullptr) {\n"
        "    if ($type_default_instance_ptr$ == nullptr) {\n"
        "      msg->$name$_ = ::$proto_ns$::Arena::CreateMessage<\n"
        "          ::$proto_ns$::internal::ImplicitWeakMessage>(\n"
        "              msg->GetArenaForAllocation());\n"
        "    } else {\n"
        "      msg->$name$_ = \n"
        "          reinterpret_cast<const ::$proto_ns$::MessageLite*>(\n"
        "              $type_default_instance_ptr$)->New(\n"
        "                  msg->GetArenaForAllocation());\n"
        "    }\n"
        "  }\n"
        "  return msg->$name$_;\n"
        "}\n");
  } else {
    // This inline accessor directly returns member field and is used in
    // Serialize such that AFDO profile correctly captures access information to
    // message fields under serialize.
    format(
        "const $type$&\n"
        "$classname$::_Internal::$name$(const $classname$* msg) {\n"
        "  return *msg->$field_member$;\n"
        "}\n");
  }
}